

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZArc3D>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZArc3D> *this,void **vtt)

{
  void *pvVar1;
  long lVar2;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(&(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine> + -2) +
            *(long *)((long)pvVar1 + -0x60)) = vtt[3];
  pzgeom::TPZArc3D::TPZArc3D(&this->fGeo);
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  for (lVar2 = 0; lVar2 != 0x48; lVar2 = lVar2 + 0x18) {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}